

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_TestShell::createTest
          (TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_TestShell *this)

{
  TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_Test *this_00;
  TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_TestShell *this_local;
  
  this_00 = (TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                         ,0x13f);
  TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_Test::
  TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(CommandLineArguments, setExcludeGroupFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-xggroup" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.invertMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}